

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::_InternalSerialize
          (GLMClassifier_DoubleArray *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  bool bVar4;
  LogMessage *other;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint size;
  size_t sVar8;
  byte *ptr;
  undefined8 *puVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (0 < (this->value_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar1 = (this->value_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    size = iVar1 << 3;
    *target = 10;
    pbVar5 = target + 1;
    uVar7 = size;
    uVar6 = size;
    if (0x7f < size) {
      do {
        target = pbVar5;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = target + 1;
        bVar4 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar4);
    }
    ptr = target + 2;
    *pbVar5 = (byte)uVar7;
    pvVar2 = (this->value_).arena_or_elements_;
    sVar8 = (size_t)(int)size;
    if ((long)stream->end_ - (long)ptr < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,pvVar2,size,ptr);
    }
    else {
      memcpy(ptr,pvVar2,sVar8);
      target = ptr + sVar8;
    }
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    pvVar2 = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar9 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar9 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    sVar8 = (size_t)(int)puVar9[1];
    if ((long)stream->end_ - (long)target < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,(int)puVar9[1],target);
    }
    else {
      memcpy(target,pvVar2,sVar8);
      target = target + sVar8;
    }
  }
  return target;
}

Assistant:

uint8_t* GLMClassifier_DoubleArray::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.GLMClassifier.DoubleArray)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double value = 1;
  if (this->_internal_value_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.GLMClassifier.DoubleArray)
  return target;
}